

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplexNlaProductForm.cpp
# Opt level: O1

void __thiscall
ProductFormUpdate::setup(ProductFormUpdate *this,HighsInt num_row,double expected_density)

{
  iterator __position;
  size_type __n;
  int local_24;
  double local_20;
  
  this->valid_ = true;
  this->num_row_ = num_row;
  this->update_count_ = 0;
  local_24 = 0;
  __position._M_current =
       (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  if (__position._M_current ==
      (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    local_20 = expected_density;
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&this->start_,__position,&local_24);
    expected_density = local_20;
  }
  else {
    *__position._M_current = 0;
    (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = __position._M_current + 1;
  }
  __n = (size_type)(int)((double)(num_row * 0x32) * expected_density + 1000.0);
  std::vector<int,_std::allocator<int>_>::reserve(&this->index_,__n);
  std::vector<double,_std::allocator<double>_>::reserve(&this->value_,__n);
  return;
}

Assistant:

void ProductFormUpdate::setup(const HighsInt num_row,
                              const double expected_density) {
  valid_ = true;
  num_row_ = num_row;
  update_count_ = 0;
  start_.push_back(0);
  HighsInt reserve_entry_space =
      kProductFormExtraEntries +
      kProductFormMaxUpdates * num_row * expected_density;
  index_.reserve(reserve_entry_space);
  value_.reserve(reserve_entry_space);
}